

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsMultiplicationSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  if ((c == 0x2a) || (c == 0xd7)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ParseSettings::IsMultiplicationSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case '*':
  case 0x00D7: // unicode multiply by symbol
    return true;
    break;
  }

  return false;
}